

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.cxx
# Opt level: O2

bool cmGetTargetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  string *__lhs;
  cmMakefile *this;
  pointer pbVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmTarget *this_00;
  cmGlobalGenerator *this_01;
  cmValue cVar4;
  ostream *poVar5;
  PolicyID id;
  MessageType t;
  string_view value;
  string_view value_00;
  string prop;
  string local_1c8;
  ostringstream e;
  size_t local_1a0;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs != 0x60) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments",(allocator<char> *)&prop);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  prop._M_string_length = 0;
  name = __lhs + 1;
  prop.field_2._M_local_buf[0] = '\0';
  this = status->Makefile;
  this_00 = cmMakefile::FindTargetToUse(this,name,false);
  if (this_00 == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar3 = cmMakefile::GetPolicyStatus(this,CMP0045,false);
    if (PVar3 - NEW < 3) {
      t = FATAL_ERROR;
      bVar2 = true;
LAB_002f6470:
      poVar5 = std::operator<<((ostream *)&e,
                               "get_target_property() called with non-existent target \"");
      poVar5 = std::operator<<(poVar5,(string *)name);
      std::operator<<(poVar5,"\".");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this,t,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if (bVar2) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar2 = false;
        goto LAB_002f6516;
      }
    }
    else if (PVar3 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x2d,id);
      poVar5 = std::operator<<((ostream *)&e,(string *)&local_1c8);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_1c8);
      bVar2 = false;
      t = AUTHOR_WARNING;
      goto LAB_002f6470;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_002f64e0:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,__lhs,
                   "-NOTFOUND");
    value_00._M_str = _e;
    value_00._M_len = local_1a0;
    cmMakefile::AddDefinition(this,__lhs,value_00);
    std::__cxx11::string::~string((string *)&e);
    bVar2 = true;
  }
  else {
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"ALIASED_TARGET");
    if ((bVar2) ||
       (bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2,"ALIAS_GLOBAL"),
       bVar2)) {
      bVar2 = cmMakefile::IsAlias(this,name);
      if (!bVar2) goto LAB_002f64e0;
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"ALIASED_TARGET");
      if (bVar2) {
        cmTarget::GetName_abi_cxx11_(this_00);
        std::__cxx11::string::_M_assign((string *)&prop);
      }
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"ALIAS_GLOBAL");
      if (bVar2) {
        this_01 = cmMakefile::GetGlobalGenerator(this);
        cmGlobalGenerator::IsAlias(this_01,name);
        std::__cxx11::string::assign((char *)&prop);
      }
    }
    else {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pbVar1[2]._M_string_length == 0) ||
         ((cVar4 = cmTarget::GetComputedProperty(this_00,pbVar1 + 2,this),
          cVar4.Value == (string *)0x0 &&
          (cVar4 = cmTarget::GetProperty
                             (this_00,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2),
          cVar4.Value == (string *)0x0)))) goto LAB_002f64e0;
      std::__cxx11::string::_M_assign((string *)&prop);
    }
    bVar2 = true;
    value._M_str = prop._M_dataplus._M_p;
    value._M_len = prop._M_string_length;
    cmMakefile::AddDefinition(this,__lhs,value);
  }
LAB_002f6516:
  std::__cxx11::string::~string((string *)&prop);
  return bVar2;
}

Assistant:

bool cmGetTargetPropertyCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string const& var = args[0];
  std::string const& targetName = args[1];
  std::string prop;
  bool prop_exists = false;
  cmMakefile& mf = status.GetMakefile();

  if (cmTarget* tgt = mf.FindTargetToUse(targetName)) {
    if (args[2] == "ALIASED_TARGET" || args[2] == "ALIAS_GLOBAL") {
      if (mf.IsAlias(targetName)) {
        prop_exists = true;
        if (args[2] == "ALIASED_TARGET") {

          prop = tgt->GetName();
        }
        if (args[2] == "ALIAS_GLOBAL") {
          prop =
            mf.GetGlobalGenerator()->IsAlias(targetName) ? "TRUE" : "FALSE";
        }
      }
    } else if (!args[2].empty()) {
      cmValue prop_cstr = nullptr;
      prop_cstr = tgt->GetComputedProperty(args[2], mf);
      if (!prop_cstr) {
        prop_cstr = tgt->GetProperty(args[2]);
      }
      if (prop_cstr) {
        prop = *prop_cstr;
        prop_exists = true;
      }
    }
  } else {
    bool issueMessage = false;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0045)) {
      case cmPolicies::WARN:
        issueMessage = true;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0045) << "\n";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
        break;
    }
    if (issueMessage) {
      e << "get_target_property() called with non-existent target \""
        << targetName << "\".";
      mf.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }
  if (prop_exists) {
    mf.AddDefinition(var, prop);
    return true;
  }
  mf.AddDefinition(var, var + "-NOTFOUND");
  return true;
}